

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Renderbuffers::StorageMultisampleTest::Check
          (StorageMultisampleTest *this,RenderbufferInternalFormatConfiguration format,GLuint width,
          GLuint height)

{
  code *pcVar1;
  bool bVar2;
  GLuint GVar3;
  GLuint GVar4;
  int iVar5;
  uint uVar6;
  deUint32 dVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  reference pvVar10;
  TestContext *pTVar11;
  TestLog *pTVar12;
  MessageBuilder *pMVar13;
  ulong uVar14;
  reference pvVar15;
  float fVar16;
  MessageBuilder local_6d8;
  uint local_558;
  allocator<int> local_551;
  GLuint i_3;
  vector<int,_std::allocator<int>_> stencil;
  uint local_3b8;
  allocator<float> local_3b1;
  GLuint i_2;
  vector<float,_std::allocator<float>_> depth;
  uint local_214;
  byte local_20d;
  GLuint i_1;
  undefined1 local_208 [3];
  bool hasComponent_1 [4];
  vector<float,_std::allocator<float>_> color_1;
  MessageBuilder local_1e8;
  uint local_64;
  byte local_60 [4];
  GLuint i;
  bool hasComponent [4];
  allocator<int> local_49;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> color;
  GLuint size;
  Functions *gl;
  GLuint height_local;
  GLuint width_local;
  StorageMultisampleTest *this_local;
  long lVar9;
  
  gl._0_4_ = height;
  gl._4_4_ = width;
  _height_local = this;
  pRVar8 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*pRVar8->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar5);
  color.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = gl._4_4_ * (GLuint)gl;
  if ((((((undefined1  [24])format & (undefined1  [24])0x1) != (undefined1  [24])0x0) ||
       (((undefined1  [24])format & (undefined1  [24])0x100) != (undefined1  [24])0x0)) ||
      (((undefined1  [24])format & (undefined1  [24])0x10000) != (undefined1  [24])0x0)) ||
     (((undefined1  [24])format & (undefined1  [24])0x1000000) != (undefined1  [24])0x0)) {
    if (((undefined1  [24])format & (undefined1  [24])0x1000000000000) == (undefined1  [24])0x0) {
      uVar6 = color.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ * 4;
      std::allocator<float>::allocator((allocator<float> *)((long)&i_1 + 3));
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_208,(ulong)uVar6,
                 (allocator<float> *)((long)&i_1 + 3));
      std::allocator<float>::~allocator((allocator<float> *)((long)&i_1 + 3));
      GVar4 = gl._4_4_;
      GVar3 = (GLuint)gl;
      pcVar1 = *(code **)(lVar9 + 0x1220);
      pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_208,0);
      (*pcVar1)(0,0,GVar4,GVar3,0x1908,0x1406,pvVar15);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"glReadPixels call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x2210);
      local_20d = format.hasRedComponent & 1;
      i_1._0_1_ = format.hasGreenComponent & 1;
      i_1._1_1_ = format.hasBlueComponent & 1;
      i_1._2_1_ = format.hasAlphaComponent & 1;
      for (local_214 = 0;
          local_214 <
          color.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_; local_214 = local_214 + 1) {
        if (((&local_20d)[local_214 & 3] & 1) != 0) {
          fVar16 = (float)(&s_reference_color)[local_214 & 3];
          pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_208,(ulong)local_214);
          fVar16 = de::abs<float>(fVar16 - *pvVar15);
          if (0.0625 < fVar16) {
            pTVar11 = deqp::Context::getTestContext((this->super_TestCase).m_context);
            pTVar12 = tcu::TestContext::getLog(pTVar11);
            tcu::TestLog::operator<<
                      ((MessageBuilder *)
                       &depth.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,pTVar12,
                       (BeginMessageToken *)&tcu::TestLog::Message);
            pMVar13 = tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)
                                 &depth.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,
                                 (char (*) [57])
                                 "Renderbuffer storage multisample was cleared with color ");
            pMVar13 = tcu::MessageBuilder::operator<<
                                (pMVar13,Check(gl4cts::DirectStateAccess::Renderbuffers::StorageMultisampleTest::RenderbufferInternalFormatConfiguration,unsigned_int,unsigned_int)
                                         ::componentName + (local_214 & 3));
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [21])0x2a7b881);
            pMVar13 = tcu::MessageBuilder::operator<<
                                (pMVar13,(float *)(&s_reference_color + (local_214 & 3)));
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [21])", but fetched value ")
            ;
            pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_208,(ulong)local_214
                                );
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,pvVar15);
            pMVar13 = tcu::MessageBuilder::operator<<
                                (pMVar13,(char (*) [44])
                                         " is not the same. Renderbuffers format was ");
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&format.internalformat_name);
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [13])", width was ");
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(uint *)((long)&gl + 4));
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [14])", height was ");
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(uint *)&gl);
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [2])0x2b6cb9a);
            tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder
                      ((MessageBuilder *)
                       &depth.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            this_local._7_1_ = 0;
            bVar2 = true;
            goto LAB_011f5190;
          }
        }
      }
      bVar2 = false;
LAB_011f5190:
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_208);
      if (bVar2) goto LAB_011f58fd;
    }
    else {
      uVar6 = color.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ * 4;
      std::allocator<int>::allocator(&local_49);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_48,(ulong)uVar6,&local_49);
      std::allocator<int>::~allocator(&local_49);
      GVar4 = gl._4_4_;
      GVar3 = (GLuint)gl;
      pcVar1 = *(code **)(lVar9 + 0x1220);
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_48,0);
      (*pcVar1)(0,0,GVar4,GVar3,0x8d99,0x1404,pvVar10);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"glReadPixels call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x21f1);
      local_60[0] = format.hasRedComponent & 1;
      local_60[1] = format.hasGreenComponent & 1;
      local_60[2] = format.hasBlueComponent & 1;
      local_60[3] = format.hasAlphaComponent & 1;
      for (local_64 = 0;
          local_64 <
          color.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_; local_64 = local_64 + 1) {
        if ((local_60[local_64 & 3] & 1) != 0) {
          iVar5 = *(int *)(s_reference_color_integer + (ulong)(local_64 & 3) * 4);
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_48,(ulong)local_64);
          iVar5 = de::abs<int>(iVar5 - *pvVar10);
          if (2 < iVar5) {
            pTVar11 = deqp::Context::getTestContext((this->super_TestCase).m_context);
            pTVar12 = tcu::TestContext::getLog(pTVar11);
            tcu::TestLog::operator<<(&local_1e8,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar13 = tcu::MessageBuilder::operator<<
                                (&local_1e8,
                                 (char (*) [57])
                                 "Renderbuffer storage multisample was cleared with color ");
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,Check::componentName + (local_64 & 3))
            ;
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [21])0x2a7b881);
            pMVar13 = tcu::MessageBuilder::operator<<
                                (pMVar13,(int (*) [4])s_reference_color_integer);
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [21])", but fetched value ")
            ;
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)local_48,(ulong)local_64);
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,pvVar10);
            pMVar13 = tcu::MessageBuilder::operator<<
                                (pMVar13,(char (*) [44])
                                         " is not the same. Renderbuffers format was ");
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&format.internalformat_name);
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [13])", width was ");
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(uint *)((long)&gl + 4));
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [14])", height was ");
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(uint *)&gl);
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [2])0x2b6cb9a);
            tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_1e8);
            this_local._7_1_ = 0;
            bVar2 = true;
            goto LAB_011f4d2a;
          }
        }
      }
      bVar2 = false;
LAB_011f4d2a:
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48)
      ;
      if (bVar2) goto LAB_011f58fd;
    }
  }
  if (((undefined1  [24])format & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
    uVar14 = (ulong)color.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_;
    std::allocator<float>::allocator(&local_3b1);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&i_2,uVar14,&local_3b1);
    std::allocator<float>::~allocator(&local_3b1);
    GVar4 = gl._4_4_;
    GVar3 = (GLuint)gl;
    pcVar1 = *(code **)(lVar9 + 0x1220);
    pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)&i_2,0);
    (*pcVar1)(0,0,GVar4,GVar3,0x1902,0x1406,pvVar15);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"glReadPixels call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x2231);
    for (local_3b8 = 0;
        local_3b8 <
        color.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_; local_3b8 = local_3b8 + 1) {
      pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)&i_2,(ulong)local_3b8);
      fVar16 = de::abs<float>(0.5 - *pvVar15);
      if (0.0625 < fVar16) {
        pTVar11 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar12 = tcu::TestContext::getLog(pTVar11);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)
                   &stencil.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,pTVar12,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar13 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)
                             &stencil.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                             (char (*) [76])
                             "Renderbuffer storage multisample was cleared with depth component equal to "
                            );
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(float *)&s_reference_depth);
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [21])", but fetched value ");
        pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)&i_2,(ulong)local_3b8);
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,pvVar15);
        pMVar13 = tcu::MessageBuilder::operator<<
                            (pMVar13,(char (*) [44])" is not the same. Renderbuffers format was ");
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&format.internalformat_name);
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [13])", width was ");
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(uint *)((long)&gl + 4));
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [14])", height was ");
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(uint *)&gl);
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [2])0x2b6cb9a);
        tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder
                  ((MessageBuilder *)
                   &stencil.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        this_local._7_1_ = 0;
        bVar2 = true;
        goto LAB_011f5547;
      }
    }
    bVar2 = false;
LAB_011f5547:
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)&i_2);
    if (bVar2) goto LAB_011f58fd;
  }
  if (((undefined1  [24])format & (undefined1  [24])0x10000000000) != (undefined1  [24])0x0) {
    uVar14 = (ulong)color.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_;
    std::allocator<int>::allocator(&local_551);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&i_3,uVar14,&local_551);
    std::allocator<int>::~allocator(&local_551);
    GVar4 = gl._4_4_;
    GVar3 = (GLuint)gl;
    pcVar1 = *(code **)(lVar9 + 0x1220);
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&i_3,0);
    (*pcVar1)(0,0,GVar4,GVar3,0x1901,0x1404,pvVar10);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"glReadPixels call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x2248);
    for (local_558 = 0;
        local_558 <
        color.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_; local_558 = local_558 + 1) {
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&i_3,(ulong)local_558);
      if (*pvVar10 != 7) {
        pTVar11 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar12 = tcu::TestContext::getLog(pTVar11);
        tcu::TestLog::operator<<(&local_6d8,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar13 = tcu::MessageBuilder::operator<<
                            (&local_6d8,
                             (char (*) [76])
                             "Renderbuffer storage multisample was cleared with alpha component equal to "
                            );
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&s_reference_stencil);
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [21])", but fetched value ");
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&i_3,(ulong)local_558);
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,pvVar10);
        pMVar13 = tcu::MessageBuilder::operator<<
                            (pMVar13,(char (*) [44])" is not the same. Renderbuffers format was ");
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&format.internalformat_name);
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [13])", width was ");
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(uint *)((long)&gl + 4));
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [14])", height was ");
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(uint *)&gl);
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [2])0x2b6cb9a);
        tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_6d8);
        this_local._7_1_ = 0;
        bVar2 = true;
        goto LAB_011f58cf;
      }
    }
    bVar2 = false;
LAB_011f58cf:
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i_3);
    if (bVar2) goto LAB_011f58fd;
  }
  this_local._7_1_ = 1;
LAB_011f58fd:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool StorageMultisampleTest::Check(StorageMultisampleTest::RenderbufferInternalFormatConfiguration format,
								   glw::GLuint width, glw::GLuint height)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLuint size = width * height;

	if (format.hasRedComponent || format.hasGreenComponent || format.hasBlueComponent || format.hasAlphaComponent)
	{
		if (format.isColorIntegralFormat)
		{
			std::vector<glw::GLint> color(size * 4);

			gl.readPixels(0, 0, width, height, GL_RGBA_INTEGER, GL_INT, &color[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");

			const bool hasComponent[] = { format.hasRedComponent, format.hasGreenComponent, format.hasBlueComponent,
										  format.hasAlphaComponent };

			static const char* componentName[] = { "red", "green", "blue", "alpha" };

			for (glw::GLuint i = 0; i < size; ++i)
			{
				if (hasComponent[i % 4 /* color components count*/])
				{
					if (de::abs(s_reference_color_integer[i % 4 /* color components count*/] - color[i]) >
						2 /* Precision */)
					{
						m_context.getTestContext().getLog()
							<< tcu::TestLog::Message << "Renderbuffer storage multisample was cleared with color "
							<< componentName[i % 4 /* color components count*/] << " component equal to "
							<< s_reference_color_integer << ", but fetched value " << color[i]
							<< " is not the same. Renderbuffers format was " << format.internalformat_name
							<< ", width was " << width << ", height was " << height << "." << tcu::TestLog::EndMessage;

						return false;
					}
				}
			}
		}
		else
		{
			std::vector<glw::GLfloat> color(size * 4);

			gl.readPixels(0, 0, width, height, GL_RGBA, GL_FLOAT, &color[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");

			const bool hasComponent[] = { format.hasRedComponent, format.hasGreenComponent, format.hasBlueComponent,
										  format.hasAlphaComponent };

			static const char* componentName[] = { "red", "green", "blue", "alpha" };

			for (glw::GLuint i = 0; i < size; ++i)
			{
				if (hasComponent[i % 4 /* color components count*/])
				{
					if (de::abs(s_reference_color[i % 4 /* color components count*/] - color[i]) >
						0.0625 /* precision */)
					{
						m_context.getTestContext().getLog()
							<< tcu::TestLog::Message << "Renderbuffer storage multisample was cleared with color "
							<< componentName[i % 4 /* color components count*/] << " component equal to "
							<< s_reference_color[i % 4 /* color components count*/] << ", but fetched value "
							<< color[i] << " is not the same. Renderbuffers format was " << format.internalformat_name
							<< ", width was " << width << ", height was " << height << "." << tcu::TestLog::EndMessage;

						return false;
					}
				}
			}
		}
	}

	if (format.hasDepthComponent)
	{
		std::vector<glw::GLfloat> depth(size);

		gl.readPixels(0, 0, width, height, GL_DEPTH_COMPONENT, GL_FLOAT, &depth[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");

		for (glw::GLuint i = 0; i < size; ++i)
		{
			if (de::abs(s_reference_depth - depth[i]) > 0.0625 /* 1/16 precision */)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "Renderbuffer storage multisample was cleared with depth component equal to "
					<< s_reference_depth << ", but fetched value " << depth[i]
					<< " is not the same. Renderbuffers format was " << format.internalformat_name << ", width was "
					<< width << ", height was " << height << "." << tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	if (format.hasStencilComponent)
	{
		std::vector<glw::GLint> stencil(size);

		gl.readPixels(0, 0, width, height, GL_STENCIL_INDEX, GL_INT, &stencil[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");

		for (glw::GLuint i = 0; i < size; ++i)
		{
			if (s_reference_stencil != stencil[i])
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "Renderbuffer storage multisample was cleared with alpha component equal to "
					<< s_reference_stencil << ", but fetched value " << stencil[i]
					<< " is not the same. Renderbuffers format was " << format.internalformat_name << ", width was "
					<< width << ", height was " << height << "." << tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	return true;
}